

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodBuilder.cpp
# Opt level: O2

size_t __thiscall Lodtalk::MethodAssembler::SendMessage::computeMaxSize(SendMessage *this)

{
  undefined8 uVar1;
  
  if ((uint)this->argumentCount < 3 && this->selectorIndex < 0x10) {
    return 1;
  }
  if (this->argumentCount < 8) {
    if (this->selectorIndex < 0x20) {
      return 2;
    }
    uVar1 = 0x223;
  }
  else {
    uVar1 = 0x220;
  }
  fprintf(_stderr,"The method %s is unimplemented in %s at line %d\n",
          "virtual size_t Lodtalk::MethodAssembler::SendMessage::computeMaxSize()",
          "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/MethodBuilder.cpp"
          ,uVar1);
  abort();
}

Assistant:

virtual size_t computeMaxSize()
	{
		if((argumentCount == 0 && selectorIndex < BytecodeSet::SendShortArgs0RangeSize) ||
			(argumentCount == 1 && selectorIndex < BytecodeSet::SendShortArgs1RangeSize) ||
			(argumentCount == 2 && selectorIndex < BytecodeSet::SendShortArgs2RangeSize))
			return 1;

		size_t count = 2;

		if(argumentCount > BytecodeSet::Send_ArgumentCountMask)
			LODTALK_UNIMPLEMENTED();

 		if(selectorIndex > BytecodeSet::Send_LiteralIndexMask)
			LODTALK_UNIMPLEMENTED();
		return count;
	}